

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraffic.cpp
# Opt level: O2

void XPluginReceiveMessage(XPLMPluginID inFrom,int inMsg,void *param_3)

{
  int iVar1;
  bool bIntoVR;
  char who [256];
  char signature [256];
  
  if (inMsg == 0x6f) {
    memset(who,0,0x100);
    who[0] = '?';
    memset(signature,0,0x100);
    XPLMGetPluginInfo(inFrom,who,0,signature,0);
    iVar1 = bcmp(signature,"TwinFan.plugin.XPMP2.Remote",0x1c);
    if (iVar1 == 0) {
      if ((int)dataRefs.iLogLevel < 2) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LiveTraffic.cpp"
               ,0x281,"XPluginReceiveMessage",logINFO,
               "XPMP2 Remote Client requested us to release TCAS / AI control, so we do.");
      }
      LTMainReleaseAIAircraft();
      MenuUpdateAllItemStatus();
    }
    else {
      if ((int)dataRefs.iLogLevel < 2) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LiveTraffic.cpp"
               ,0x285,"XPluginReceiveMessage",logINFO,
               "%s requested us to release TCAS / AI control. Switch off \'TCAS controlled\' if you want so."
               ,who);
      }
      CreateMsgWindow(8.0,logINFO,
                      "%s requested us to release TCAS / AI control. Switch off \'TCAS controlled\' if you want so."
                      ,who);
    }
  }
  else if (inFrom == 0) {
    if (inMsg == 0x6e) {
      bIntoVR = false;
    }
    else {
      if (inMsg != 0x6d) {
        return;
      }
      bIntoVR = true;
    }
    ACIWnd::MoveAllVR(bIntoVR);
    return;
  }
  return;
}

Assistant:

PLUGIN_API void XPluginReceiveMessage(XPLMPluginID inFrom, int inMsg, void * /*inParam*/)
{
    // *** Some other plugin asks for AI release,
    //     but as we are showing live planes we won't give up automatically,
    //     but we tell our user
    if (inMsg == XPLM_MSG_RELEASE_PLANES)
    {
        char who[256] = "?";
        char signature[256] = "";
        XPLMGetPluginInfo(inFrom, who, NULL, signature, NULL);
        
        // We do cease control to the XPMP2 Remote Control plugin
        // because that one will display our traffic, too:
        if (strncmp(signature, REMOTE_SIGNATURE, sizeof(signature)) == 0) {
            LOG_MSG(logINFO, INFO_REQU_AI_REMOTE);
            LTMainReleaseAIAircraft();
            MenuUpdateAllItemStatus();
        } else {
            SHOW_MSG(logINFO, INFO_REQU_AI_RELEASE, who);
        }
        return;
    }

    // Otherwise, we only process msgs from X-Plane
    if (inFrom != XPLM_PLUGIN_XPLANE)
        return;
    
#ifdef DEBUG
    // for me not having a VR rig I do some basic testing with sending XPLM_MSG_AIRPLANE_COUNT_CHANGED
    if (inMsg == XPLM_MSG_AIRPLANE_COUNT_CHANGED) {
        dataRefs.bSimVREntered = !dataRefs.bSimVREntered;
        inMsg = dataRefs.bSimVREntered ? XPLM_MSG_ENTERED_VR : XPLM_MSG_EXITING_VR;
    }
#endif
    
    switch (inMsg) {
        // *** entering VR mode ***
        case XPLM_MSG_ENTERED_VR:
            ACIWnd::MoveAllVR(true);
            break;
            
        // *** existing from VR mode ***
        case XPLM_MSG_EXITING_VR:
            ACIWnd::MoveAllVR(false);
            break;
    }
}